

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O2

void __thiscall sf::priv::WindowImplX11::setSize(WindowImplX11 *this,Vector2u *size)

{
  uint uVar1;
  uint uVar2;
  undefined8 *puVar3;
  
  if (this->m_useSizeHints == true) {
    puVar3 = (undefined8 *)XAllocSizeHints();
    *puVar3 = 0x30;
    uVar1 = size->x;
    uVar2 = size->y;
    *(uint *)(puVar3 + 3) = uVar1;
    *(uint *)((long)puVar3 + 0x1c) = uVar2;
    *(uint *)(puVar3 + 4) = uVar1;
    *(uint *)((long)puVar3 + 0x24) = uVar2;
    XSetWMNormalHints(this->m_display,this->m_window,puVar3);
    XFree(puVar3);
  }
  XResizeWindow(this->m_display,this->m_window,size->x,size->y);
  XFlush(this->m_display);
  return;
}

Assistant:

void WindowImplX11::setSize(const Vector2u& size)
{
    // If resizing is disable for the window we have to update the size hints (required by some window managers).
    if (m_useSizeHints)
    {
        XSizeHints* sizeHints = XAllocSizeHints();
        sizeHints->flags = PMinSize | PMaxSize;
        sizeHints->min_width = sizeHints->max_width = size.x;
        sizeHints->min_height = sizeHints->max_height = size.y;
        XSetWMNormalHints(m_display, m_window, sizeHints);
        XFree(sizeHints);
    }

    XResizeWindow(m_display, m_window, size.x, size.y);
    XFlush(m_display);
}